

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_force_ip.cc
# Opt level: O3

int runForceIP(string *command,int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  array<unsigned_char,_4UL> aVar4;
  array<unsigned_char,_4UL> aVar5;
  array<unsigned_char,_4UL> aVar6;
  int iVar7;
  undefined8 uVar8;
  ostream *poVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  pointer pDVar13;
  string p;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  string local_f8;
  int local_d4;
  string *local_d0;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_c8;
  ulong local_b0;
  DeviceFilter local_a8;
  
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = 0;
  local_b0 = 0;
  local_d0 = command;
  do {
    if (argc <= iVar7) goto LAB_001117c4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,argv[iVar7],(allocator<char> *)&local_c8);
    iVar12 = iVar7 + 1;
    uVar8 = std::__cxx11::string::compare((char *)&local_f8);
    iVar3 = 0;
    if ((int)uVar8 == 0) {
      local_b0 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
      iVar7 = iVar12;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_f8);
      if (iVar3 == 0) {
        iVar7 = parseFilterArguments(argc - iVar12,argv + iVar12,&local_a8);
        iVar7 = iVar7 + iVar12;
        iVar3 = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_f8);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_f8), iVar3 == 0))
        {
          printHelp((ostream *)&std::cout,local_d0);
          local_d4 = 0;
          iVar3 = 1;
          iVar7 = iVar12;
        }
        else {
          iVar3 = 3;
          if ((local_f8._M_string_length != 0) && (*local_f8._M_dataplus._M_p == '-')) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid argument: ",0x12);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_f8._M_dataplus._M_p,
                                local_f8._M_string_length);
            local_c8.
            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
            _M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator<char>)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_c8,1);
            printHelp((ostream *)&std::cerr,local_d0);
            local_d4 = 1;
            iVar7 = iVar12;
            iVar3 = 1;
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
  } while (iVar3 == 0);
  iVar12 = local_d4;
  if (iVar3 != 3) goto LAB_00111b9c;
LAB_001117c4:
  if (((local_a8.mac.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_a8.mac.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      (local_a8.name.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_a8.name.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (local_a8.serial.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a8.serial.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    lVar10 = 0xd;
    pcVar11 = "No filter set";
  }
  else {
    if (iVar7 + 3 == argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,argv[iVar7],(allocator<char> *)&local_c8);
      aVar4 = string2byte<4u>(&local_f8,10,'.');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,argv[(long)iVar7 + 1],(allocator<char> *)&local_c8);
      aVar5 = string2byte<4u>(&local_f8,10,'.');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,argv[(long)iVar7 + 2],(allocator<char> *)&local_c8);
      aVar6 = string2byte<4u>(&local_f8,10,'.');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      discoverWithFilter(&local_c8,&local_a8);
      if ((pointer)CONCAT71(local_c8.
                            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_c8.
                            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_1_) ==
          local_c8.
          super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar10 = 0xf;
        pcVar11 = "No device found";
LAB_00111b55:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        iVar12 = 0;
        std::ostream::flush();
      }
      else {
        if ((ulong)((long)local_c8.
                          super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)CONCAT71(local_c8.
                                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_c8.
                                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)) < 0x101) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Setting the IP address of the following device:\n",0x30)
          ;
          printDeviceTable((ostream *)&std::cout,&local_c8,true,false,false);
          if ((local_b0 & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Are you sure? [y/N] ",0x14);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            local_f8._M_string_length = 0;
            local_f8.field_2._M_local_buf[0] = '\0';
            cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x78);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)&local_f8,cVar2);
            iVar7 = std::__cxx11::string::compare((char *)&local_f8);
            bVar1 = true;
            if ((iVar7 != 0) &&
               (iVar7 = std::__cxx11::string::compare((char *)&local_f8), iVar7 != 0)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cancel",6);
              bVar1 = false;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              local_d4 = 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,
                              CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                       local_f8.field_2._M_local_buf[0]) + 1);
            }
            iVar12 = local_d4;
            if (!bVar1) goto LAB_00111b92;
          }
          pDVar13 = (pointer)CONCAT71(local_c8.
                                      super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      local_c8.
                                      super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
          lVar10 = 4;
          pcVar11 = "Done";
          if (pDVar13 !=
              local_c8.
              super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            do {
              rcdiscover::ForceIP::ForceIP((ForceIP *)&local_f8);
              rcdiscover::ForceIP::sendCommand
                        ((ForceIP *)&local_f8,pDVar13->mac,
                         (uint)aVar4._M_elems >> 0x18 | ((uint)aVar4._M_elems & 0xff0000) >> 8 |
                         ((uint)aVar4._M_elems & 0xff00) << 8 | (int)aVar4._M_elems << 0x18,
                         (uint)aVar5._M_elems >> 0x18 | ((uint)aVar5._M_elems & 0xff0000) >> 8 |
                         ((uint)aVar5._M_elems & 0xff00) << 8 | (int)aVar5._M_elems << 0x18,
                         (uint)aVar6._M_elems >> 0x18 | ((uint)aVar6._M_elems & 0xff0000) >> 8 |
                         ((uint)aVar6._M_elems & 0xff00) << 8 | (int)aVar6._M_elems << 0x18);
              std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
              ~vector((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                      &local_f8);
              pDVar13 = pDVar13 + 1;
            } while (pDVar13 !=
                     local_c8.
                     super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
            lVar10 = 4;
            pcVar11 = "Done";
          }
          goto LAB_00111b55;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found more than one device matching the filter criteria.",
                   0x38);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
        printDeviceTable((ostream *)&std::cout,&local_c8,true,false,false);
        iVar12 = 0;
      }
LAB_00111b92:
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
                (&local_c8);
      goto LAB_00111b9c;
    }
    lVar10 = 0x37;
    pcVar11 = "IP address, subnet mask and default gateway must be set";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar10);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  printHelp((ostream *)&std::cerr,local_d0);
  iVar12 = 1;
LAB_00111b9c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.model);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.iface);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.mac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.serial);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.name);
  return iVar12;
}

Assistant:

int runForceIP(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  int i = 0;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else if (!p.empty() && p[0] == '-')
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
    else
    {
      --i;
      break;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  if (i + 3 != argc)
  {
    std::cerr << "IP address, subnet mask and default gateway must be set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  std::array<uint8_t, 4> ip;
  std::array<uint8_t, 4> mask;
  std::array<uint8_t, 4> gateway;

  try
  {
    ip = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse IP address" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  try
  {
    mask = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse subnet mask" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  try
  {
    gateway = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse default gateway" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  if (devices.size() > 1)
  {
    std::cout << "Found more than one device matching the filter criteria." << std::endl;
    printDeviceTable(std::cout, devices, true, false, false);
    return 0;
  }

  std::cout << "Setting the IP address of the following device:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::ForceIP force_ip;
    force_ip.sendCommand(device.getMAC(),
                         byteArrayToInt(ip),
                         byteArrayToInt(mask),
                         byteArrayToInt(gateway));
  }

  std::cout << "Done" << std::endl;

  return 0;
}